

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landbasedwheeled.cpp
# Opt level: O0

void __thiscall fp::LandBasedWheeled::PickUp(LandBasedWheeled *this,string *string)

{
  ostream *poVar1;
  string *string_local;
  LandBasedWheeled *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"LandBasedWheeled::Pickup the payload is called\n")
  ;
  poVar1 = std::operator<<(poVar1,(string *)string);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void fp::LandBasedWheeled::PickUp(std::string string) {
    std::cerr << "LandBasedWheeled::Pickup the payload is called\n" << string << std::endl;
}